

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::emit_header(CompilerGLSL *this)

{
  Bitset *this_00;
  long lVar1;
  Precision PVar2;
  Capability *pCVar3;
  size_t sVar4;
  _Alloc_hider *p_Var5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  SPIREntryPoint *pSVar9;
  char *pcVar10;
  uint64_t uVar11;
  CompilerError *this_01;
  uint *z;
  undefined8 extraout_RDX;
  undefined8 uVar12;
  undefined8 extraout_RDX_00;
  ShaderSubgroupSupportHelper *this_02;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  long lVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  long lVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  SpecializationConstant wg_z;
  char *local_270;
  char *local_268;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  inputs;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  outputs;
  
  pSVar9 = Compiler::get_entry_point(&this->super_Compiler);
  pcVar10 = " es";
  if ((this->options).version < 0x65) {
    pcVar10 = "";
  }
  if ((this->options).es == false) {
    pcVar10 = "";
  }
  inputs.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar10;
  statement<char_const(&)[10],unsigned_int&,char_const*>
            (this,(char (*) [10])"#version ",&(this->options).version,(char **)&inputs);
  if (((this->options).es == false) && ((this->options).version < 0x1a4)) {
    if ((this->options).enable_420pack_extension == true) {
      statement<char_const(&)[39]>(this,(char (*) [39])"#ifdef GL_ARB_shading_language_420pack");
      statement<char_const(&)[53]>
                (this,(char (*) [53])"#extension GL_ARB_shading_language_420pack : require");
      statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
    }
    if (((pSVar9->flags).lower & 0x200) != 0) {
      ::std::__cxx11::string::string
                ((string *)&inputs,"GL_ARB_shader_image_load_store",(allocator *)&outputs);
      require_extension_internal(this,(string *)&inputs);
      ::std::__cxx11::string::~string((string *)&inputs);
    }
  }
  this_00 = &pSVar9->flags;
  bVar6 = Bitset::get(this_00,0x115e);
  if (bVar6) {
    ::std::__cxx11::string::string
              ((string *)&inputs,"GL_ARB_post_depth_coverage",(allocator *)&outputs);
    require_extension_internal(this,(string *)&inputs);
    ::std::__cxx11::string::~string((string *)&inputs);
  }
  bVar6 = Bitset::get(this_00,0x14f6);
  if ((((bVar6) || (bVar6 = Bitset::get(this_00,0x14f7), bVar6)) ||
      (bVar6 = Bitset::get(this_00,0x14f8), bVar6)) || (bVar6 = Bitset::get(this_00,0x14f9), bVar6))
  {
    uVar8 = (this->options).version;
    if ((this->options).es == true) {
      if (uVar8 < 0x136) {
        this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_01,"At least ESSL 3.10 required for fragment shader interlock.");
        __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::__cxx11::string::string
                ((string *)&inputs,"GL_NV_fragment_shader_interlock",(allocator *)&outputs);
      require_extension_internal(this,(string *)&inputs);
    }
    else {
      if (uVar8 < 0x1a4) {
        ::std::__cxx11::string::string
                  ((string *)&inputs,"GL_ARB_shader_image_load_store",(allocator *)&outputs);
        require_extension_internal(this,(string *)&inputs);
        ::std::__cxx11::string::~string((string *)&inputs);
      }
      ::std::__cxx11::string::string
                ((string *)&inputs,"GL_ARB_fragment_shader_interlock",(allocator *)&outputs);
      require_extension_internal(this,(string *)&inputs);
    }
    ::std::__cxx11::string::~string((string *)&inputs);
    bVar6 = true;
  }
  else {
    bVar6 = false;
  }
  pbVar14 = (this->forced_extensions).
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .ptr;
  for (lVar13 = (this->forced_extensions).
                super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .buffer_size << 5; lVar13 != 0; lVar13 = lVar13 + -0x20) {
    bVar7 = ::std::operator==(pbVar14,"GL_ARB_gpu_shader_int64");
    if (bVar7) {
      statement<char_const(&)[37]>(this,(char (*) [37])"#if defined(GL_ARB_gpu_shader_int64)");
      statement<char_const(&)[45]>
                (this,(char (*) [45])"#extension GL_ARB_gpu_shader_int64 : require");
      if (((this->options).vulkan_semantics != true) || ((this->options).es == true)) {
        statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
        statement<char_const(&)[39]>(this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require");
      }
      statement<char_const(&)[6]>(this,(char (*) [6])"#else");
      statement<char_const(&)[51]>
                (this,(char (*) [51])"#error No extension available for 64-bit integers.");
      goto LAB_00224a54;
    }
    bVar7 = ::std::operator==(pbVar14,"GL_EXT_shader_explicit_arithmetic_types_float16");
    if (bVar7) {
      statement<char_const(&)[42]>(this,(char (*) [42])"#if defined(GL_AMD_gpu_shader_half_float)");
      statement<char_const(&)[50]>
                (this,(char (*) [50])"#extension GL_AMD_gpu_shader_half_float : require");
      if ((this->options).vulkan_semantics == false) {
        statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
        statement<char_const(&)[39]>(this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require");
      }
      else {
        statement<char_const(&)[63]>
                  (this,(char (*) [63])
                        "#elif defined(GL_EXT_shader_explicit_arithmetic_types_float16)");
        statement<char_const(&)[69]>
                  (this,(char (*) [69])
                        "#extension GL_EXT_shader_explicit_arithmetic_types_float16 : require");
      }
      statement<char_const(&)[6]>(this,(char (*) [6])"#else");
      pcVar10 = "#error No extension available for FP16.";
LAB_00224a4f:
      statement<char_const(&)[40]>(this,(char (*) [40])pcVar10);
LAB_00224a54:
      statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
    }
    else {
      bVar7 = ::std::operator==(pbVar14,"GL_EXT_shader_explicit_arithmetic_types_int8");
      if (bVar7) {
        if ((this->options).vulkan_semantics == true) {
          statement<char_const(&)[66]>
                    (this,(char (*) [66])
                          "#extension GL_EXT_shader_explicit_arithmetic_types_int8 : require");
          goto LAB_00224a5f;
        }
        statement<char_const(&)[58]>
                  (this,(char (*) [58])"#if defined(GL_EXT_shader_explicit_arithmetic_types_int8)");
        statement<char_const(&)[66]>
                  (this,(char (*) [66])
                        "#extension GL_EXT_shader_explicit_arithmetic_types_int8 : require");
        statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
        statement<char_const(&)[39]>(this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require");
        statement<char_const(&)[6]>(this,(char (*) [6])"#else");
        pcVar10 = "#error No extension available for Int8.";
        goto LAB_00224a4f;
      }
      bVar7 = ::std::operator==(pbVar14,"GL_EXT_shader_explicit_arithmetic_types_int16");
      if (bVar7) {
        if ((this->options).vulkan_semantics == true) {
          statement<char_const(&)[67]>
                    (this,(char (*) [67])
                          "#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
          goto LAB_00224a5f;
        }
        statement<char_const(&)[59]>
                  (this,(char (*) [59])"#if defined(GL_EXT_shader_explicit_arithmetic_types_int16)")
        ;
        statement<char_const(&)[67]>
                  (this,(char (*) [67])
                        "#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
        statement<char_const(&)[39]>(this,(char (*) [39])"#elif defined(GL_AMD_gpu_shader_int16)");
        statement<char_const(&)[45]>
                  (this,(char (*) [45])"#extension GL_AMD_gpu_shader_int16 : require");
        statement<char_const(&)[33]>(this,(char (*) [33])"#elif defined(GL_NV_gpu_shader5)");
        statement<char_const(&)[39]>(this,(char (*) [39])"#extension GL_NV_gpu_shader5 : require");
        statement<char_const(&)[6]>(this,(char (*) [6])"#else");
        statement<char_const(&)[41]>(this,(char (*) [41])"#error No extension available for Int16.")
        ;
        goto LAB_00224a54;
      }
      bVar7 = ::std::operator==(pbVar14,"GL_ARB_post_depth_coverage");
      if (bVar7) {
        if ((this->options).es == true) {
          statement<char_const(&)[48]>
                    (this,(char (*) [48])"#extension GL_EXT_post_depth_coverage : require");
          goto LAB_00224a5f;
        }
        statement<char_const(&)[39]>(this,(char (*) [39])"#if defined(GL_ARB_post_depth_coverge)");
        statement<char_const(&)[48]>
                  (this,(char (*) [48])"#extension GL_ARB_post_depth_coverage : require");
        statement<char_const(&)[6]>(this,(char (*) [6])"#else");
        statement<char_const(&)[48]>
                  (this,(char (*) [48])"#extension GL_EXT_post_depth_coverage : require");
        goto LAB_00224a54;
      }
      if (((this->options).vulkan_semantics == false) &&
         (bVar7 = ::std::operator==(pbVar14,"GL_ARB_shader_draw_parameters"), bVar7)) {
        statement<char_const(&)[8],std::__cxx11::string&>(this,(char (*) [8])"#ifdef ",pbVar14);
        statement<char_const(&)[12],std::__cxx11::string&,char_const(&)[10]>
                  (this,(char (*) [12])"#extension ",pbVar14,(char (*) [10])0x2c5515);
        goto LAB_00224a54;
      }
      bVar7 = ::std::operator==(pbVar14,"GL_EXT_control_flow_attributes");
      if (bVar7) {
        statement<char_const(&)[44]>
                  (this,(char (*) [44])"#if defined(GL_EXT_control_flow_attributes)");
        statement<char_const(&)[52]>
                  (this,(char (*) [52])"#extension GL_EXT_control_flow_attributes : require");
        statement<char_const(&)[40]>(this,(char (*) [40])"#define SPIRV_CROSS_FLATTEN [[flatten]]");
        statement<char_const(&)[44]>
                  (this,(char (*) [44])"#define SPIRV_CROSS_BRANCH [[dont_flatten]]");
        statement<char_const(&)[38]>(this,(char (*) [38])"#define SPIRV_CROSS_UNROLL [[unroll]]");
        statement<char_const(&)[41]>(this,(char (*) [41])"#define SPIRV_CROSS_LOOP [[dont_unroll]]")
        ;
        statement<char_const(&)[6]>(this,(char (*) [6])"#else");
        statement<char_const(&)[28]>(this,(char (*) [28])"#define SPIRV_CROSS_FLATTEN");
        statement<char_const(&)[27]>(this,(char (*) [27])"#define SPIRV_CROSS_BRANCH");
        statement<char_const(&)[27]>(this,(char (*) [27])"#define SPIRV_CROSS_UNROLL");
        statement<char_const(&)[25]>(this,(char (*) [25])"#define SPIRV_CROSS_LOOP");
        goto LAB_00224a54;
      }
      bVar7 = ::std::operator==(pbVar14,"GL_NV_fragment_shader_interlock");
      if (bVar7) {
        statement<char_const(&)[53]>
                  (this,(char (*) [53])"#extension GL_NV_fragment_shader_interlock : require");
        statement<char_const(&)[76]>
                  (this,(char (*) [76])
                        "#define SPIRV_Cross_beginInvocationInterlock() beginInvocationInterlockNV()"
                  );
        statement<char_const(&)[72]>
                  (this,(char (*) [72])
                        "#define SPIRV_Cross_endInvocationInterlock() endInvocationInterlockNV()");
      }
      else {
        bVar7 = ::std::operator==(pbVar14,"GL_ARB_fragment_shader_interlock");
        if (bVar7) {
          statement<char_const(&)[40]>
                    (this,(char (*) [40])"#ifdef GL_ARB_fragment_shader_interlock");
          statement<char_const(&)[53]>
                    (this,(char (*) [53])"#extension GL_ARB_fragment_shader_interlock : enable");
          statement<char_const(&)[77]>
                    (this,(char (*) [77])
                          "#define SPIRV_Cross_beginInvocationInterlock() beginInvocationInterlockARB()"
                    );
          statement<char_const(&)[73]>
                    (this,(char (*) [73])
                          "#define SPIRV_Cross_endInvocationInterlock() endInvocationInterlockARB()"
                    );
          statement<char_const(&)[49]>
                    (this,(char (*) [49])"#elif defined(GL_INTEL_fragment_shader_ordering)");
          statement<char_const(&)[54]>
                    (this,(char (*) [54])"#extension GL_INTEL_fragment_shader_ordering : enable");
          statement<char_const(&)[82]>
                    (this,(char (*) [82])
                          "#define SPIRV_Cross_beginInvocationInterlock() beginFragmentShaderOrderingINTEL()"
                    );
          statement<char_const(&)[45]>
                    (this,(char (*) [45])"#define SPIRV_Cross_endInvocationInterlock()");
          goto LAB_00224a54;
        }
        statement<char_const(&)[12],std::__cxx11::string&,char_const(&)[11]>
                  (this,(char (*) [12])"#extension ",pbVar14,(char (*) [11])0x2c4d16);
      }
    }
LAB_00224a5f:
    pbVar14 = pbVar14 + 1;
  }
  if ((this->options).vulkan_semantics == false) {
    ShaderSubgroupSupportHelper::resolve((Result *)&wg_x,&this->shader_subgroup_supporter);
    for (lVar13 = 0; lVar13 != 0x1c; lVar13 = lVar13 + 1) {
      if (((this->shader_subgroup_supporter).feature_mask >>
           ((Feature)lVar13 & (FeatureCount|SubgroupID)) & 1) != 0) {
        ShaderSubgroupSupportHelper::get_candidates_for_feature
                  ((CandidateVector *)&outputs,(Feature)lVar13,(Result *)&wg_x);
        if (outputs.
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .buffer_size != 0) {
          statement<char_const(&)[1]>(this,(char (*) [1])0x2a9b09);
          lVar1 = outputs.
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .buffer_size * 4;
          p_Var5 = &(outputs.
                     super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .ptr)->_M_dataplus;
          uVar12 = extraout_RDX;
          for (pbVar14 = outputs.
                         super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .ptr;
              pbVar14 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&p_Var5->_M_p + lVar1);
              pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&(pbVar14->_M_dataplus)._M_p + 4)) {
            this_02 = (ShaderSubgroupSupportHelper *)(ulong)*(uint *)&(pbVar14->_M_dataplus)._M_p;
            pcVar10 = (char *)((long)"\x05\x05\x04" + 3);
            if (this_02 == (ShaderSubgroupSupportHelper *)0x9) {
              pcVar10 = "(defined(GL_AMD_gpu_shader_int64) || defined(GL_NV_gpu_shader5))";
            }
            wg_y = *(SpecializationConstant *)
                    (ShaderSubgroupSupportHelper::get_extension_name::retval + (long)this_02);
            if (this_02 == (ShaderSubgroupSupportHelper *)0x7) {
              pcVar10 = "defined(GL_ARB_shader_int64)";
            }
            wg_z = (SpecializationConstant)pcVar10;
            ShaderSubgroupSupportHelper::get_extra_required_extension_names_abi_cxx11_
                      (&inputs,this_02,(Candidate)uVar12);
            local_268 = "#elif";
            if (pbVar14 ==
                outputs.
                super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .ptr) {
              local_268 = "#if";
            }
            local_270 = " && ";
            if (*(char *)wg_z == '\0') {
              local_270 = "";
            }
            statement<char_const*,char_const(&)[10],char_const*&,char_const(&)[2],char_const*,char_const*&>
                      (this,&local_268,(char (*) [10])" defined(",(char **)&wg_y,
                       (char (*) [2])0x2cdc84,&local_270,(char **)&wg_z);
            ts_1 = inputs.
                   super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .ptr;
            for (lVar15 = inputs.
                          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .buffer_size << 5; lVar15 != 0; lVar15 = lVar15 + -0x20) {
              statement<char_const(&)[12],std::__cxx11::string_const&,char_const(&)[10]>
                        (this,(char (*) [12])"#extension ",ts_1,(char (*) [10])0x2c5515);
              ts_1 = ts_1 + 1;
            }
            statement<char_const(&)[12],char_const*&,char_const(&)[11]>
                      (this,(char (*) [12])"#extension ",(char **)&wg_y,(char (*) [11])0x2c4d16);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::~SmallVector(&inputs);
            uVar12 = extraout_RDX_00;
          }
          if (ShaderSubgroupSupportHelper::can_feature_be_implemented_without_extensions::retval
              [lVar13] == false) {
            statement<char_const(&)[6]>(this,(char (*) [6])"#else");
            statement<char_const(&)[70]>
                      (this,(char (*) [70])
                            "#error No extensions available to emulate requested subgroup feature.")
            ;
          }
          statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
        }
        SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
        ~SmallVector((SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>
                      *)&outputs);
      }
    }
  }
  pbVar14 = (this->header_lines).
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .ptr;
  for (lVar13 = (this->header_lines).
                super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                .buffer_size << 5; lVar13 != 0; lVar13 = lVar13 + -0x20) {
    statement<std::__cxx11::string&>(this,pbVar14);
    pbVar14 = pbVar14 + 1;
  }
  inputs.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inputs.stack_storage;
  inputs.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  inputs.buffer_capacity = 8;
  outputs.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outputs.stack_storage
  ;
  outputs.
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  outputs.buffer_capacity = 8;
  z = &switchD_00224e6a::switchdataD_002c2ab0;
  switch(pSVar9->model) {
  case ExecutionModelVertex:
    if ((this->options).ovr_multiview_view_count == 0) goto LAB_002257c7;
    join<char_const(&)[13],unsigned_int&>
              ((string *)&wg_x,(spirv_cross *)"num_views = ",
               (char (*) [13])&(this->options).ovr_multiview_view_count,
               &switchD_00224e6a::switchdataD_002c2ab0);
    goto LAB_00225708;
  case ExecutionModelTessellationControl:
    if (((pSVar9->flags).lower & 0x4000000) == 0) goto LAB_002257c7;
    join<char_const(&)[12],unsigned_int&>
              ((string *)&wg_x,(spirv_cross *)0x2c564d,(char (*) [12])&pSVar9->output_vertices,
               &switchD_00224e6a::switchdataD_002c2ab0);
    break;
  case ExecutionModelTessellationEvaluation:
    uVar11 = this_00->lower;
    if (((uint)uVar11 >> 0x18 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"quads",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar11 = this_00->lower;
    }
    if (((uint)uVar11 >> 0x16 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"triangles",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar11 = this_00->lower;
    }
    if (((uint)uVar11 >> 0x19 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"isolines",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar11 = this_00->lower;
    }
    if (((uint)uVar11 >> 10 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"point_mode",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar11 = this_00->lower;
    }
    if (((uint)uVar11 >> 0x19 & 1) == 0) {
      if ((uVar11 & 0x10) != 0) {
        ::std::__cxx11::string::string((string *)&wg_x,"cw",(allocator *)&wg_y);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &wg_x);
        ::std::__cxx11::string::~string((string *)&wg_x);
        uVar11 = this_00->lower;
      }
      if ((uVar11 & 0x20) != 0) {
        ::std::__cxx11::string::string((string *)&wg_x,"ccw",(allocator *)&wg_y);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &wg_x);
        ::std::__cxx11::string::~string((string *)&wg_x);
        uVar11 = this_00->lower;
      }
    }
    if ((uVar11 & 4) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"fractional_even_spacing",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar11 = this_00->lower;
    }
    if ((uVar11 & 8) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"fractional_odd_spacing",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar11 = this_00->lower;
    }
    if ((uVar11 & 2) == 0) goto LAB_002257c7;
    ::std::__cxx11::string::string((string *)&wg_x,"equal_spacing",(allocator *)&wg_y);
LAB_00225708:
    this_03 = &inputs;
    goto LAB_002257b2;
  case ExecutionModelGeometry:
    uVar8 = (uint)this_00->lower;
    if (((this_00->lower & 1) != 0) && (pSVar9->invocations != 1)) {
      join<char_const(&)[15],unsigned_int&>
                ((string *)&wg_x,(spirv_cross *)"invocations = ",(char (*) [15])&pSVar9->invocations
                 ,&switchD_00224e6a::switchdataD_002c2ab0);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar8 = (uint)this_00->lower;
    }
    if ((uVar8 >> 0x13 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"points",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar8 = (uint)this_00->lower;
    }
    if ((uVar8 >> 0x14 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"lines",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar8 = (uint)this_00->lower;
    }
    if ((uVar8 >> 0x15 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"lines_adjacency",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar8 = (uint)this_00->lower;
    }
    if ((uVar8 >> 0x16 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"triangles",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar8 = (uint)this_00->lower;
    }
    if ((uVar8 >> 0x17 & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"triangles_adjacency",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
    }
    if (pSVar9->geometry_passthrough != false) goto LAB_002257c7;
    join<char_const(&)[16],unsigned_int&>
              ((string *)&wg_x,(spirv_cross *)"max_vertices = ",
               (char (*) [16])&pSVar9->output_vertices,z);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&outputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x)
    ;
    ::std::__cxx11::string::~string((string *)&wg_x);
    uVar8 = (uint)this_00->lower;
    if ((uVar8 >> 0x1d & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"triangle_strip",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&outputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &wg_x);
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar8 = (uint)this_00->lower;
    }
    if ((uVar8 >> 0x1b & 1) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"points",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&outputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &wg_x);
      ::std::__cxx11::string::~string((string *)&wg_x);
      uVar8 = (uint)this_00->lower;
    }
    if ((uVar8 >> 0x1c & 1) == 0) goto LAB_002257c7;
    ::std::__cxx11::string::string((string *)&wg_x,"line_strip",(allocator *)&wg_y);
    break;
  case ExecutionModelFragment:
    if ((this->options).es == true) {
      PVar2 = (this->options).fragment.default_float_precision;
      if (PVar2 == Highp) {
        statement<char_const(&)[23]>(this,(char (*) [23])"precision highp float;");
      }
      else if (PVar2 == Mediump) {
        statement<char_const(&)[25]>(this,(char (*) [25])"precision mediump float;");
      }
      else if (PVar2 == Lowp) {
        statement<char_const(&)[22]>(this,(char (*) [22])"precision lowp float;");
      }
      PVar2 = (this->options).fragment.default_int_precision;
      if (PVar2 == Highp) {
        statement<char_const(&)[21]>(this,(char (*) [21])"precision highp int;");
      }
      else if (PVar2 == Mediump) {
        statement<char_const(&)[23]>(this,(char (*) [23])"precision mediump int;");
      }
      else if (PVar2 == Lowp) {
        statement<char_const(&)[20]>(this,(char (*) [20])"precision lowp int;");
      }
    }
    if (((pSVar9->flags).lower & 0x200) != 0) {
      ::std::__cxx11::string::string((string *)&wg_x,"early_fragment_tests",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
    }
    bVar7 = Bitset::get(this_00,0x115e);
    if (bVar7) {
      ::std::__cxx11::string::string((string *)&wg_x,"post_depth_coverage",(allocator *)&wg_y);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
    }
    if (bVar6) {
      statement<char_const(&)[46]>
                (this,(char (*) [46])"#if defined(GL_ARB_fragment_shader_interlock)");
    }
    bVar7 = Bitset::get(this_00,0x14f6);
    if (bVar7) {
      statement<char_const(&)[36]>(this,(char (*) [36])"layout(pixel_interlock_ordered) in;");
    }
    else {
      bVar7 = Bitset::get(this_00,0x14f7);
      if (bVar7) {
        statement<char_const(&)[38]>(this,(char (*) [38])"layout(pixel_interlock_unordered) in;");
      }
      else {
        bVar7 = Bitset::get(this_00,0x14f8);
        if (bVar7) {
          statement<char_const(&)[37]>(this,(char (*) [37])"layout(sample_interlock_ordered) in;");
        }
        else {
          bVar7 = Bitset::get(this_00,0x14f9);
          if (bVar7) {
            statement<char_const(&)[39]>
                      (this,(char (*) [39])"layout(sample_interlock_unordered) in;");
          }
        }
      }
    }
    if (bVar6) {
      statement<char_const(&)[50]>
                (this,(char (*) [50])"#elif !defined(GL_INTEL_fragment_shader_ordering)");
      statement<char_const(&)[61]>
                (this,(char (*) [61])"#error Fragment Shader Interlock/Ordering extension missing!")
      ;
      statement<char_const(&)[7]>(this,(char (*) [7])"#endif");
    }
    if ((this->options).es == false) {
      if (((uint)this_00->lower >> 0xe & 1) == 0) {
        if ((short)this_00->lower < 0) {
          statement<char_const(&)[43]>
                    (this,(char (*) [43])"layout(depth_less) out float gl_FragDepth;");
        }
      }
      else {
        statement<char_const(&)[46]>
                  (this,(char (*) [46])"layout(depth_greater) out float gl_FragDepth;");
      }
    }
    goto LAB_002257c7;
  case ExecutionModelGLCompute:
    goto switchD_00224e6a_caseD_5;
  default:
    z = (uint *)(SpecializationConstant *)0x8;
    if (1 < pSVar9->model - ExecutionModelTaskEXT) goto LAB_002257c7;
switchD_00224e6a_caseD_5:
    if (((pSVar9->workgroup_size).constant == 0) && (((pSVar9->flags).lower & 0x4000000000) == 0)) {
      join<char_const(&)[16],unsigned_int&>
                ((string *)&wg_x,(spirv_cross *)"local_size_x = ",
                 (char (*) [16])&pSVar9->workgroup_size,z);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      join<char_const(&)[16],unsigned_int&>
                ((string *)&wg_x,(spirv_cross *)"local_size_y = ",
                 (char (*) [16])&(pSVar9->workgroup_size).y,z);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
      join<char_const(&)[16],unsigned_int&>
                ((string *)&wg_x,(spirv_cross *)"local_size_z = ",
                 (char (*) [16])&(pSVar9->workgroup_size).z,z);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&inputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x
                 );
      ::std::__cxx11::string::~string((string *)&wg_x);
    }
    else {
      wg_x.id.id = 0;
      wg_y = (SpecializationConstant)((ulong)wg_y & 0xffffffff00000000);
      z = (uint *)&wg_z;
      wg_z = (SpecializationConstant)((ulong)wg_z & 0xffffffff00000000);
      Compiler::get_work_group_size_specialization_constants
                (&this->super_Compiler,&wg_x,&wg_y,(SpecializationConstant *)z);
      if (((this->options).vulkan_semantics != false) ||
         (((wg_x.id.id == 0 && (wg_y.id.id == 0)) && (wg_z.id.id == 0)))) {
        z = (uint *)&wg_y;
        build_workgroup_size(this,&inputs,&wg_x,(SpecializationConstant *)z,&wg_z);
      }
    }
    if (pSVar9->model != ExecutionModelMeshEXT) goto LAB_002257c7;
    join<char_const(&)[16],unsigned_int&>
              ((string *)&wg_x,(spirv_cross *)"max_vertices = ",
               (char (*) [16])&pSVar9->output_vertices,z);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&outputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x)
    ;
    ::std::__cxx11::string::~string((string *)&wg_x);
    join<char_const(&)[18],unsigned_int&>
              ((string *)&wg_x,(spirv_cross *)"max_primitives = ",
               (char (*) [18])&pSVar9->output_primitives,z);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(&outputs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x)
    ;
    ::std::__cxx11::string::~string((string *)&wg_x);
    bVar6 = Bitset::get(this_00,0x14b2);
    if (bVar6) {
      ::std::__cxx11::string::string((string *)&wg_x,"triangles",(allocator *)&wg_y);
    }
    else {
      bVar6 = Bitset::get(this_00,0x1495);
      if (bVar6) {
        ::std::__cxx11::string::string((string *)&wg_x,"lines",(allocator *)&wg_y);
      }
      else {
        if (((pSVar9->flags).lower & 0x8000000) == 0) goto LAB_002257c7;
        ::std::__cxx11::string::string((string *)&wg_x,"points",(allocator *)&wg_y);
      }
    }
  }
  this_03 = &outputs;
LAB_002257b2:
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::push_back(this_03,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x);
  ::std::__cxx11::string::~string((string *)&wg_x);
LAB_002257c7:
  pCVar3 = (this->super_Compiler).ir.declared_capabilities.super_VectorView<spv::Capability>.ptr;
  sVar4 = (this->super_Compiler).ir.declared_capabilities.super_VectorView<spv::Capability>.
          buffer_size;
  for (lVar13 = 0; sVar4 << 2 != lVar13; lVar13 = lVar13 + 4) {
    if (*(int *)((long)pCVar3 + lVar13) == 0x117e) {
      statement<char_const(&)[27]>(this,(char (*) [27])"layout(primitive_culling);");
    }
  }
  if (inputs.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .buffer_size != 0) {
    merge((string *)&wg_x,&inputs,", ");
    statement<char_const(&)[8],std::__cxx11::string,char_const(&)[6]>
              (this,(char (*) [8])"layout(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x,
               (char (*) [6])0x2c5812);
    ::std::__cxx11::string::~string((string *)&wg_x);
  }
  if (outputs.
      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .buffer_size != 0) {
    merge((string *)&wg_x,&outputs,", ");
    statement<char_const(&)[8],std::__cxx11::string,char_const(&)[7]>
              (this,(char (*) [8])"layout(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wg_x,
               (char (*) [7])") out;");
    ::std::__cxx11::string::~string((string *)&wg_x);
  }
  statement<char_const(&)[1]>(this,(char (*) [1])0x2a9b09);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector(&outputs);
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  ::~SmallVector(&inputs);
  return;
}

Assistant:

void CompilerGLSL::emit_header()
{
	auto &execution = get_entry_point();
	statement("#version ", options.version, options.es && options.version > 100 ? " es" : "");

	if (!options.es && options.version < 420)
	{
		// Needed for binding = # on UBOs, etc.
		if (options.enable_420pack_extension)
		{
			statement("#ifdef GL_ARB_shading_language_420pack");
			statement("#extension GL_ARB_shading_language_420pack : require");
			statement("#endif");
		}
		// Needed for: layout(early_fragment_tests) in;
		if (execution.flags.get(ExecutionModeEarlyFragmentTests))
			require_extension_internal("GL_ARB_shader_image_load_store");
	}

	// Needed for: layout(post_depth_coverage) in;
	if (execution.flags.get(ExecutionModePostDepthCoverage))
		require_extension_internal("GL_ARB_post_depth_coverage");

	// Needed for: layout({pixel,sample}_interlock_[un]ordered) in;
	bool interlock_used = execution.flags.get(ExecutionModePixelInterlockOrderedEXT) ||
	                      execution.flags.get(ExecutionModePixelInterlockUnorderedEXT) ||
	                      execution.flags.get(ExecutionModeSampleInterlockOrderedEXT) ||
	                      execution.flags.get(ExecutionModeSampleInterlockUnorderedEXT);

	if (interlock_used)
	{
		if (options.es)
		{
			if (options.version < 310)
				SPIRV_CROSS_THROW("At least ESSL 3.10 required for fragment shader interlock.");
			require_extension_internal("GL_NV_fragment_shader_interlock");
		}
		else
		{
			if (options.version < 420)
				require_extension_internal("GL_ARB_shader_image_load_store");
			require_extension_internal("GL_ARB_fragment_shader_interlock");
		}
	}

	for (auto &ext : forced_extensions)
	{
		if (ext == "GL_ARB_gpu_shader_int64")
		{
			statement("#if defined(GL_ARB_gpu_shader_int64)");
			statement("#extension GL_ARB_gpu_shader_int64 : require");
			if (!options.vulkan_semantics || options.es)
			{
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
			}
			statement("#else");
			statement("#error No extension available for 64-bit integers.");
			statement("#endif");
		}
		else if (ext == "GL_EXT_shader_explicit_arithmetic_types_float16")
		{
			// Special case, this extension has a potential fallback to another vendor extension in normal GLSL.
			// GL_AMD_gpu_shader_half_float is a superset, so try that first.
			statement("#if defined(GL_AMD_gpu_shader_half_float)");
			statement("#extension GL_AMD_gpu_shader_half_float : require");
			if (!options.vulkan_semantics)
			{
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
			}
			else
			{
				statement("#elif defined(GL_EXT_shader_explicit_arithmetic_types_float16)");
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_float16 : require");
			}
			statement("#else");
			statement("#error No extension available for FP16.");
			statement("#endif");
		}
		else if (ext == "GL_EXT_shader_explicit_arithmetic_types_int8")
		{
			if (options.vulkan_semantics)
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int8 : require");
			else
			{
				statement("#if defined(GL_EXT_shader_explicit_arithmetic_types_int8)");
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int8 : require");
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
				statement("#else");
				statement("#error No extension available for Int8.");
				statement("#endif");
			}
		}
		else if (ext == "GL_EXT_shader_explicit_arithmetic_types_int16")
		{
			if (options.vulkan_semantics)
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
			else
			{
				statement("#if defined(GL_EXT_shader_explicit_arithmetic_types_int16)");
				statement("#extension GL_EXT_shader_explicit_arithmetic_types_int16 : require");
				statement("#elif defined(GL_AMD_gpu_shader_int16)");
				statement("#extension GL_AMD_gpu_shader_int16 : require");
				statement("#elif defined(GL_NV_gpu_shader5)");
				statement("#extension GL_NV_gpu_shader5 : require");
				statement("#else");
				statement("#error No extension available for Int16.");
				statement("#endif");
			}
		}
		else if (ext == "GL_ARB_post_depth_coverage")
		{
			if (options.es)
				statement("#extension GL_EXT_post_depth_coverage : require");
			else
			{
				statement("#if defined(GL_ARB_post_depth_coverge)");
				statement("#extension GL_ARB_post_depth_coverage : require");
				statement("#else");
				statement("#extension GL_EXT_post_depth_coverage : require");
				statement("#endif");
			}
		}
		else if (!options.vulkan_semantics && ext == "GL_ARB_shader_draw_parameters")
		{
			// Soft-enable this extension on plain GLSL.
			statement("#ifdef ", ext);
			statement("#extension ", ext, " : enable");
			statement("#endif");
		}
		else if (ext == "GL_EXT_control_flow_attributes")
		{
			// These are just hints so we can conditionally enable and fallback in the shader.
			statement("#if defined(GL_EXT_control_flow_attributes)");
			statement("#extension GL_EXT_control_flow_attributes : require");
			statement("#define SPIRV_CROSS_FLATTEN [[flatten]]");
			statement("#define SPIRV_CROSS_BRANCH [[dont_flatten]]");
			statement("#define SPIRV_CROSS_UNROLL [[unroll]]");
			statement("#define SPIRV_CROSS_LOOP [[dont_unroll]]");
			statement("#else");
			statement("#define SPIRV_CROSS_FLATTEN");
			statement("#define SPIRV_CROSS_BRANCH");
			statement("#define SPIRV_CROSS_UNROLL");
			statement("#define SPIRV_CROSS_LOOP");
			statement("#endif");
		}
		else if (ext == "GL_NV_fragment_shader_interlock")
		{
			statement("#extension GL_NV_fragment_shader_interlock : require");
			statement("#define SPIRV_Cross_beginInvocationInterlock() beginInvocationInterlockNV()");
			statement("#define SPIRV_Cross_endInvocationInterlock() endInvocationInterlockNV()");
		}
		else if (ext == "GL_ARB_fragment_shader_interlock")
		{
			statement("#ifdef GL_ARB_fragment_shader_interlock");
			statement("#extension GL_ARB_fragment_shader_interlock : enable");
			statement("#define SPIRV_Cross_beginInvocationInterlock() beginInvocationInterlockARB()");
			statement("#define SPIRV_Cross_endInvocationInterlock() endInvocationInterlockARB()");
			statement("#elif defined(GL_INTEL_fragment_shader_ordering)");
			statement("#extension GL_INTEL_fragment_shader_ordering : enable");
			statement("#define SPIRV_Cross_beginInvocationInterlock() beginFragmentShaderOrderingINTEL()");
			statement("#define SPIRV_Cross_endInvocationInterlock()");
			statement("#endif");
		}
		else
			statement("#extension ", ext, " : require");
	}

	if (!options.vulkan_semantics)
	{
		using Supp = ShaderSubgroupSupportHelper;
		auto result = shader_subgroup_supporter.resolve();

		for (uint32_t feature_index = 0; feature_index < Supp::FeatureCount; feature_index++)
		{
			auto feature = static_cast<Supp::Feature>(feature_index);
			if (!shader_subgroup_supporter.is_feature_requested(feature))
				continue;

			auto exts = Supp::get_candidates_for_feature(feature, result);
			if (exts.empty())
				continue;

			statement("");

			for (auto &ext : exts)
			{
				const char *name = Supp::get_extension_name(ext);
				const char *extra_predicate = Supp::get_extra_required_extension_predicate(ext);
				auto extra_names = Supp::get_extra_required_extension_names(ext);
				statement(&ext != &exts.front() ? "#elif" : "#if", " defined(", name, ")",
				          (*extra_predicate != '\0' ? " && " : ""), extra_predicate);
				for (const auto &e : extra_names)
					statement("#extension ", e, " : enable");
				statement("#extension ", name, " : require");
			}

			if (!Supp::can_feature_be_implemented_without_extensions(feature))
			{
				statement("#else");
				statement("#error No extensions available to emulate requested subgroup feature.");
			}

			statement("#endif");
		}
	}

	for (auto &header : header_lines)
		statement(header);

	SmallVector<string> inputs;
	SmallVector<string> outputs;

	switch (execution.model)
	{
	case ExecutionModelVertex:
		if (options.ovr_multiview_view_count)
			inputs.push_back(join("num_views = ", options.ovr_multiview_view_count));
		break;
	case ExecutionModelGeometry:
		if ((execution.flags.get(ExecutionModeInvocations)) && execution.invocations != 1)
			inputs.push_back(join("invocations = ", execution.invocations));
		if (execution.flags.get(ExecutionModeInputPoints))
			inputs.push_back("points");
		if (execution.flags.get(ExecutionModeInputLines))
			inputs.push_back("lines");
		if (execution.flags.get(ExecutionModeInputLinesAdjacency))
			inputs.push_back("lines_adjacency");
		if (execution.flags.get(ExecutionModeTriangles))
			inputs.push_back("triangles");
		if (execution.flags.get(ExecutionModeInputTrianglesAdjacency))
			inputs.push_back("triangles_adjacency");

		if (!execution.geometry_passthrough)
		{
			// For passthrough, these are implies and cannot be declared in shader.
			outputs.push_back(join("max_vertices = ", execution.output_vertices));
			if (execution.flags.get(ExecutionModeOutputTriangleStrip))
				outputs.push_back("triangle_strip");
			if (execution.flags.get(ExecutionModeOutputPoints))
				outputs.push_back("points");
			if (execution.flags.get(ExecutionModeOutputLineStrip))
				outputs.push_back("line_strip");
		}
		break;

	case ExecutionModelTessellationControl:
		if (execution.flags.get(ExecutionModeOutputVertices))
			outputs.push_back(join("vertices = ", execution.output_vertices));
		break;

	case ExecutionModelTessellationEvaluation:
		if (execution.flags.get(ExecutionModeQuads))
			inputs.push_back("quads");
		if (execution.flags.get(ExecutionModeTriangles))
			inputs.push_back("triangles");
		if (execution.flags.get(ExecutionModeIsolines))
			inputs.push_back("isolines");
		if (execution.flags.get(ExecutionModePointMode))
			inputs.push_back("point_mode");

		if (!execution.flags.get(ExecutionModeIsolines))
		{
			if (execution.flags.get(ExecutionModeVertexOrderCw))
				inputs.push_back("cw");
			if (execution.flags.get(ExecutionModeVertexOrderCcw))
				inputs.push_back("ccw");
		}

		if (execution.flags.get(ExecutionModeSpacingFractionalEven))
			inputs.push_back("fractional_even_spacing");
		if (execution.flags.get(ExecutionModeSpacingFractionalOdd))
			inputs.push_back("fractional_odd_spacing");
		if (execution.flags.get(ExecutionModeSpacingEqual))
			inputs.push_back("equal_spacing");
		break;

	case ExecutionModelGLCompute:
	case ExecutionModelTaskEXT:
	case ExecutionModelMeshEXT:
	{
		if (execution.workgroup_size.constant != 0 || execution.flags.get(ExecutionModeLocalSizeId))
		{
			SpecializationConstant wg_x, wg_y, wg_z;
			get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

			// If there are any spec constants on legacy GLSL, defer declaration, we need to set up macro
			// declarations before we can emit the work group size.
			if (options.vulkan_semantics ||
			    ((wg_x.id == ConstantID(0)) && (wg_y.id == ConstantID(0)) && (wg_z.id == ConstantID(0))))
				build_workgroup_size(inputs, wg_x, wg_y, wg_z);
		}
		else
		{
			inputs.push_back(join("local_size_x = ", execution.workgroup_size.x));
			inputs.push_back(join("local_size_y = ", execution.workgroup_size.y));
			inputs.push_back(join("local_size_z = ", execution.workgroup_size.z));
		}

		if (execution.model == ExecutionModelMeshEXT)
		{
			outputs.push_back(join("max_vertices = ", execution.output_vertices));
			outputs.push_back(join("max_primitives = ", execution.output_primitives));
			if (execution.flags.get(ExecutionModeOutputTrianglesEXT))
				outputs.push_back("triangles");
			else if (execution.flags.get(ExecutionModeOutputLinesEXT))
				outputs.push_back("lines");
			else if (execution.flags.get(ExecutionModeOutputPoints))
				outputs.push_back("points");
		}
		break;
	}

	case ExecutionModelFragment:
		if (options.es)
		{
			switch (options.fragment.default_float_precision)
			{
			case Options::Lowp:
				statement("precision lowp float;");
				break;

			case Options::Mediump:
				statement("precision mediump float;");
				break;

			case Options::Highp:
				statement("precision highp float;");
				break;

			default:
				break;
			}

			switch (options.fragment.default_int_precision)
			{
			case Options::Lowp:
				statement("precision lowp int;");
				break;

			case Options::Mediump:
				statement("precision mediump int;");
				break;

			case Options::Highp:
				statement("precision highp int;");
				break;

			default:
				break;
			}
		}

		if (execution.flags.get(ExecutionModeEarlyFragmentTests))
			inputs.push_back("early_fragment_tests");
		if (execution.flags.get(ExecutionModePostDepthCoverage))
			inputs.push_back("post_depth_coverage");

		if (interlock_used)
			statement("#if defined(GL_ARB_fragment_shader_interlock)");

		if (execution.flags.get(ExecutionModePixelInterlockOrderedEXT))
			statement("layout(pixel_interlock_ordered) in;");
		else if (execution.flags.get(ExecutionModePixelInterlockUnorderedEXT))
			statement("layout(pixel_interlock_unordered) in;");
		else if (execution.flags.get(ExecutionModeSampleInterlockOrderedEXT))
			statement("layout(sample_interlock_ordered) in;");
		else if (execution.flags.get(ExecutionModeSampleInterlockUnorderedEXT))
			statement("layout(sample_interlock_unordered) in;");

		if (interlock_used)
		{
			statement("#elif !defined(GL_INTEL_fragment_shader_ordering)");
			statement("#error Fragment Shader Interlock/Ordering extension missing!");
			statement("#endif");
		}

		if (!options.es && execution.flags.get(ExecutionModeDepthGreater))
			statement("layout(depth_greater) out float gl_FragDepth;");
		else if (!options.es && execution.flags.get(ExecutionModeDepthLess))
			statement("layout(depth_less) out float gl_FragDepth;");

		break;

	default:
		break;
	}

	for (auto &cap : ir.declared_capabilities)
		if (cap == CapabilityRayTraversalPrimitiveCullingKHR)
			statement("layout(primitive_culling);");

	if (!inputs.empty())
		statement("layout(", merge(inputs), ") in;");
	if (!outputs.empty())
		statement("layout(", merge(outputs), ") out;");

	statement("");
}